

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionIDTestCase.cpp
# Opt level: O1

void __thiscall
SuiteSessionIDTests::TestfromString_SessionStringMissingRightArrow_StringNotPopulated::
~TestfromString_SessionStringMissingRightArrow_StringNotPopulated
          (TestfromString_SessionStringMissingRightArrow_StringNotPopulated *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(fromString_SessionStringMissingRightArrow_StringNotPopulated)
{
  std::string sessionString = "FIX.4.2:SENDER<-TARGET";

  SessionID object;
  object.fromString(sessionString);

  CHECK_EQUAL("", object.getBeginString());
  CHECK_EQUAL("", object.getSenderCompID());
  CHECK_EQUAL("", object.getTargetCompID());
}